

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_speed(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  long *local_20;
  ghost_level *l;
  ghost *g;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    for (local_20 = *(long **)((long)pvVar2 + 0x18); *local_20 != 0; local_20 = (long *)*local_20) {
    }
    wVar1 = parser_getint(p,"add");
    *(wchar_t *)(local_20 + 6) = wVar1;
    wVar1 = parser_getint(p,"max");
    *(wchar_t *)((long)local_20 + 0x34) = wVar1;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x800,"enum parser_error parse_ghost_speed(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_speed(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->speed.param1 = parser_getint(p, "add");
	l->speed.param2 = parser_getint(p, "max");
	return PARSE_ERROR_NONE;
}